

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreditLimitCalculator.c
# Opt level: O0

int main(void)

{
  float local_24;
  float local_20;
  float creditLimit;
  float totalCredits;
  float totalCharges;
  float finalBalance;
  float beginningBalance;
  int accountNumber;
  
  beginningBalance = 0.0;
  finalBalance = 0.0;
  totalCharges = 0.0;
  creditLimit = 0.0;
  local_20 = 0.0;
  local_24 = 0.0;
  printf("%s","Enter account number (-1 to end): ");
  __isoc99_scanf("%d",&finalBalance);
  while (finalBalance != -NAN) {
    printf("%s","Enter beginning balance: ");
    __isoc99_scanf("%f",&totalCharges);
    printf("%s","Enter total charges: ");
    __isoc99_scanf("%f",&creditLimit);
    printf("%s","Enter total credits: ");
    __isoc99_scanf("%f",&local_20);
    printf("%s","Enter credit limit: ");
    __isoc99_scanf("%f",&local_24);
    totalCredits = (totalCharges + creditLimit) - local_20;
    if (local_24 < totalCredits) {
      printf("%s %d\n","Account:      ",(ulong)(uint)finalBalance);
      printf("%s %0.2f\n",(double)local_24,"Credit limit: ");
      printf("%s %0.2f\n",(double)totalCredits,"Balance:      ");
      printf("%s\n\n","Credit Limit Exceeded.\n");
    }
    printf("\n%s","Enter account number (-1 to end): ");
    __isoc99_scanf("%d",&finalBalance);
  }
  return 0;
}

Assistant:

int main (void) {
    int accountNumber = 0;
    float beginningBalance = 0.0;
    float finalBalance;
    float totalCharges = 0.0;
    float totalCredits = 0.0;
    float creditLimit = 0.0;

    printf("%s", "Enter account number (-1 to end): ");
    scanf("%d", &accountNumber);
    while (accountNumber != -1) {
        printf("%s", "Enter beginning balance: ");
        scanf("%f", &beginningBalance);
        printf("%s", "Enter total charges: ");
        scanf("%f", &totalCharges);
        printf("%s", "Enter total credits: ");
        scanf("%f", &totalCredits);
        printf("%s", "Enter credit limit: ");
        scanf("%f", &creditLimit);

        finalBalance = (beginningBalance + totalCharges) - totalCredits;

        if (finalBalance > creditLimit) {
            printf("%s %d\n", "Account:      ", accountNumber);
            printf("%s %0.2f\n", "Credit limit: ", creditLimit);
            printf("%s %0.2f\n", "Balance:      ", finalBalance);
            printf("%s\n\n", "Credit Limit Exceeded.\n");
        }


        printf("\n%s", "Enter account number (-1 to end): ");
        scanf("%d", &accountNumber);

    }

    return 0;

}